

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_idclev(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FString local_48 [3];
  FString local_30;
  FString mapname;
  int iStack_20;
  char buf [2];
  int map;
  int epsd;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if ((((!netgame) && (iVar2 = FCommandLine::argc(argv), 1 < iVar2)) &&
      (pcVar3 = FCommandLine::operator[](argv,1), pcVar3[2] == '\0')) &&
     ((pcVar3 = FCommandLine::operator[](argv,1), pcVar3[1] != '\0' &&
      (pcVar3 = FCommandLine::operator[](argv,1), *pcVar3 != '\0')))) {
    FString::FString(&local_30);
    pcVar3 = FCommandLine::operator[](argv,1);
    mapname.Chars._2_1_ = *pcVar3 + -0x30;
    pcVar3 = FCommandLine::operator[](argv,1);
    mapname.Chars._3_1_ = pcVar3[1] + -0x30;
    if ((gameinfo.flags & 1U) == 0) {
      iStack_20 = (int)mapname.Chars._2_1_;
      mapname.Chars._4_4_ = (int)mapname.Chars._3_1_;
    }
    else {
      iStack_20 = 1;
      mapname.Chars._4_4_ = mapname.Chars._2_1_ * 10 + (int)mapname.Chars._3_1_;
    }
    CalcMapName((int)local_48,iStack_20);
    FString::operator=(&local_30,local_48);
    FString::~FString(local_48);
    pcVar3 = FString::operator_cast_to_char_(&local_30);
    bVar1 = P_CheckMapData(pcVar3);
    if (bVar1) {
      pcVar3 = FStringTable::operator()(&GStrings,"STSTR_CLEV");
      Printf("%s\n",pcVar3);
      pcVar3 = FString::operator_cast_to_char_(&local_30);
      G_DeferedInitNew(pcVar3,-1);
    }
    FString::~FString(&local_30);
  }
  return;
}

Assistant:

CCMD (idclev)
{
	if (netgame)
		return;

	if ((argv.argc() > 1) && (*(argv[1] + 2) == 0) && *(argv[1] + 1) && *argv[1])
	{
		int epsd, map;
		char buf[2];
		FString mapname;

		buf[0] = argv[1][0] - '0';
		buf[1] = argv[1][1] - '0';

		if (gameinfo.flags & GI_MAPxx)
		{
			epsd = 1;
			map = buf[0]*10 + buf[1];
		}
		else
		{
			epsd = buf[0];
			map = buf[1];
		}

		// Catch invalid maps.
		mapname = CalcMapName (epsd, map);

		if (!P_CheckMapData(mapname))
			return;

		// So be it.
		Printf ("%s\n", GStrings("STSTR_CLEV"));
      	G_DeferedInitNew (mapname);
		//players[0].health = 0;		// Force reset
	}
}